

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall
AActor::TakeInventory
          (AActor *this,PClassActor *itemclass,int amount,bool fromdecorate,bool notakeinfinite)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  AInventory *this_00;
  int iVar4;
  
  iVar4 = -amount;
  if (0 < amount) {
    iVar4 = amount;
  }
  this_00 = FindInventory(this,itemclass,false);
  if (this_00 != (AInventory *)0x0) {
    iVar1 = this_00->Amount;
    if (fromdecorate) {
      bVar2 = DObject::IsKindOf((DObject *)this_00,AHexenArmor::RegistrationInfo.MyClass);
      if ((!bVar2) &&
         ((!notakeinfinite ||
          ((((dmflags.Value._1_1_ & 8) == 0 &&
            ((this->player == (player_t *)0x0 || ((this->player->cheats & 0x800000) == 0)))) ||
           (bVar2 = DObject::IsKindOf((DObject *)this_00,AAmmo::RegistrationInfo.MyClass), !bVar2)))
          ))) {
        if ((amount != 0) &&
           (iVar3 = this_00->Amount - iVar4, iVar3 != 0 && iVar4 <= this_00->Amount)) {
          this_00->Amount = iVar3;
          return 0 < iVar1;
        }
        (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(this_00);
        return 0 < iVar1;
      }
    }
    else {
      this_00->Amount = iVar1 - iVar4;
      if (iVar1 - iVar4 == 0 || iVar1 < iVar4) {
        (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(this_00);
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool AActor::TakeInventory(PClassActor *itemclass, int amount, bool fromdecorate, bool notakeinfinite)
{
	amount = abs(amount);
	AInventory *item = FindInventory(itemclass);

	if (item == NULL)
		return false;

	if (!fromdecorate)
	{
		item->Amount -= amount;
		if (item->Amount <= 0)
		{
			item->DepleteOrDestroy();
		}
		// It won't be used in non-decorate context, so return false here
		return false;
	}

	bool result = false;
	if (item->Amount > 0)
	{
		result = true;
	}

	if (item->IsKindOf(RUNTIME_CLASS(AHexenArmor)))
		return false;

	// Do not take ammo if the "no take infinite/take as ammo depletion" flag is set
	// and infinite ammo is on
	if (notakeinfinite &&
	((dmflags & DF_INFINITE_AMMO) || (player && player->cheats & CF_INFINITEAMMO)) &&
		item->IsKindOf(RUNTIME_CLASS(AAmmo)))
	{
		// Nothing to do here, except maybe res = false;? Would it make sense?
		result = false;
	}
	else if (!amount || amount>=item->Amount)
	{
		item->DepleteOrDestroy();
	}
	else item->Amount-=amount;

	return result;
}